

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void __thiscall CUI::Update(CUI *this,float MouseX,float MouseY,float MouseWorldX,float MouseWorldY)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  
  bVar1 = this->m_Enabled;
  uVar2 = 0;
  if ((bool)bVar1 == true) {
    uVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x19b);
    iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x19c);
    uVar5 = (uVar2 & 0xff) + 2;
    if ((char)iVar3 == '\0') {
      uVar5 = uVar2 & 0xff;
    }
    iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x19d);
    uVar2 = uVar5 + 4;
    if ((char)iVar3 == '\0') {
      uVar2 = uVar5;
    }
    bVar1 = this->m_Enabled;
  }
  this->m_MouseX = MouseX;
  this->m_MouseY = MouseY;
  this->m_MouseWorldX = MouseWorldX;
  this->m_MouseWorldY = MouseWorldY;
  this->m_LastMouseButtons = this->m_MouseButtons;
  this->m_MouseButtons = uVar2;
  pvVar4 = this->m_pActiveItem;
  if (pvVar4 == (void *)0x0) {
    pvVar4 = this->m_pBecommingHotItem;
  }
  this->m_pHotItem = pvVar4;
  this->m_pBecommingHotItem = (void *)0x0;
  if ((((bVar1 & 1) != 0) && (CLineInput::s_pActiveInput != (CLineInput *)0x0)) &&
     (CLineInput::s_pActiveInput != (CLineInput *)this->m_pLastActiveItem &&
      (CLineInput *)this->m_pLastActiveItem != (CLineInput *)0x0)) {
    CLineInput::Deactivate(CLineInput::s_pActiveInput);
    return;
  }
  return;
}

Assistant:

void CUI::Update(float MouseX, float MouseY, float MouseWorldX, float MouseWorldY)
{
	unsigned MouseButtons = 0;
	if(Enabled())
	{
		if(Input()->KeyIsPressed(KEY_MOUSE_1)) MouseButtons |= 1;
		if(Input()->KeyIsPressed(KEY_MOUSE_2)) MouseButtons |= 2;
		if(Input()->KeyIsPressed(KEY_MOUSE_3)) MouseButtons |= 4;
	}

	m_MouseX = MouseX;
	m_MouseY = MouseY;
	m_MouseWorldX = MouseWorldX;
	m_MouseWorldY = MouseWorldY;
	m_LastMouseButtons = m_MouseButtons;
	m_MouseButtons = MouseButtons;
	m_pHotItem = m_pBecommingHotItem;
	if(m_pActiveItem)
		m_pHotItem = m_pActiveItem;
	m_pBecommingHotItem = 0;

	if(Enabled())
	{
		CLineInput *pActiveInput = CLineInput::GetActiveInput();
		if(pActiveInput && m_pLastActiveItem && pActiveInput != m_pLastActiveItem)
			pActiveInput->Deactivate();
	}
}